

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O1

int libssh2_base64_decode(LIBSSH2_SESSION *session,char **data,uint *datalen,char *src,uint src_len)

{
  ushort uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  byte *pbVar6;
  uint uVar7;
  byte bVar8;
  char cVar9;
  bool bVar10;
  
  pcVar2 = (char *)(*session->alloc)((ulong)((src_len * 3 >> 2) + 1),&session->abstract);
  *data = pcVar2;
  if (pcVar2 == (char *)0x0) {
    if ((session->err_flags & 1) != 0) {
      (*session->free)(session->err_msg,&session->abstract);
    }
    session->err_code = -6;
    session->err_flags = 0;
    session->err_msg = "Unable to allocate memory for base64 decoding";
    iVar3 = -6;
  }
  else {
    if (src_len == 0) {
      bVar10 = false;
      uVar4 = 0;
    }
    else {
      pbVar6 = (byte *)(src + src_len);
      uVar5 = 0;
      uVar7 = 0;
      do {
        uVar1 = base64_reverse_table[(byte)*src];
        if ((short)uVar1 < 0) goto LAB_00117375;
        bVar8 = (byte)uVar1;
        iVar3 = (int)uVar5;
        switch((int)uVar7 % 4) {
        case 0:
          pcVar2[iVar3] = bVar8 * '\x04';
          break;
        case 1:
          pcVar2[iVar3] = pcVar2[iVar3] | (byte)(uVar1 >> 4);
          cVar9 = bVar8 << 4;
          goto LAB_0011736e;
        case 2:
          pcVar2[iVar3] = pcVar2[iVar3] | (byte)(uVar1 >> 2);
          cVar9 = bVar8 << 6;
LAB_0011736e:
          uVar5 = (long)iVar3 + 1;
          pcVar2[(long)iVar3 + 1] = cVar9;
          break;
        case 3:
          uVar5 = (ulong)(iVar3 + 1);
          pcVar2[iVar3] = pcVar2[iVar3] | bVar8;
        }
        uVar7 = uVar7 + 1;
LAB_00117375:
        uVar4 = (uint)uVar5;
        src = (char *)((byte *)src + 1);
      } while (src < pbVar6);
      bVar10 = (uVar7 & 0x80000003) == 1;
    }
    if (bVar10) {
      (*session->free)(*data,&session->abstract);
      if ((session->err_flags & 1) != 0) {
        (*session->free)(session->err_msg,&session->abstract);
      }
      session->err_code = -0x22;
      session->err_flags = 0;
      session->err_msg = "Invalid base64";
      iVar3 = -0x22;
    }
    else {
      *datalen = uVar4;
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

LIBSSH2_API int
libssh2_base64_decode(LIBSSH2_SESSION *session, char **data,
                      unsigned int *datalen, const char *src,
                      unsigned int src_len)
{
    unsigned char *s, *d;
    short v;
    int i = 0, len = 0;

    *data = LIBSSH2_ALLOC(session, (3 * src_len / 4) + 1);
    d = (unsigned char *) *data;
    if (!d) {
        return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                              "Unable to allocate memory for base64 decoding");
    }

    for(s = (unsigned char *) src; ((char *) s) < (src + src_len); s++) {
        if ((v = base64_reverse_table[*s]) < 0)
            continue;
        switch (i % 4) {
        case 0:
            d[len] = (unsigned char)(v << 2);
            break;
        case 1:
            d[len++] |= v >> 4;
            d[len] = (unsigned char)(v << 4);
            break;
        case 2:
            d[len++] |= v >> 2;
            d[len] = (unsigned char)(v << 6);
            break;
        case 3:
            d[len++] |= v;
            break;
        }
        i++;
    }
    if ((i % 4) == 1) {
        /* Invalid -- We have a byte which belongs exclusively to a partial
           octet */
        LIBSSH2_FREE(session, *data);
        return _libssh2_error(session, LIBSSH2_ERROR_INVAL, "Invalid base64");
    }

    *datalen = len;
    return 0;
}